

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

StatementMap * __thiscall
Js::FunctionBody::GetMatchingStatementMapFromByteCode
          (FunctionBody *this,int byteCodeOffset,bool ignoreSubexpressions)

{
  StatementMap *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  StatementMapList *this_00;
  undefined4 *puVar5;
  WriteBarrierPtr *this_01;
  StatementMap **ppSVar6;
  StatementMap *pStatementMap;
  int index;
  StatementMapList *pStatementMaps;
  bool ignoreSubexpressions_local;
  int byteCodeOffset_local;
  FunctionBody *this_local;
  
  this_00 = GetStatementMaps(this);
  if (this_00 != (StatementMapList *)0x0) {
    if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xbf4,"(m_sourceInfo.pSpanSequence == nullptr)",
                                  "m_sourceInfo.pSpanSequence == nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    for (pStatementMap._4_4_ = 0;
        iVar4 = JsUtil::
                ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
                Count(&this_00->
                       super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                     ), pStatementMap._4_4_ < iVar4; pStatementMap._4_4_ = pStatementMap._4_4_ + 1)
    {
      this_01 = (WriteBarrierPtr *)
                JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,pStatementMap._4_4_);
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_StatementMap__(this_01);
      pSVar1 = *ppSVar6;
      if (((!ignoreSubexpressions) || ((pSVar1->isSubexpression & 1U) == 0)) &&
         (bVar3 = regex::Interval::Includes(&pSVar1->byteCodeSpan,byteCodeOffset), bVar3)) {
        return pSVar1;
      }
    }
  }
  return (StatementMap *)0x0;
}

Assistant:

FunctionBody::StatementMap* FunctionBody::GetMatchingStatementMapFromByteCode(int byteCodeOffset, bool ignoreSubexpressions /* = false */)
    {
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps)
        {
            Assert(m_sourceInfo.pSpanSequence == nullptr);
            for (int index = 0; index < pStatementMaps->Count(); index++)
            {
                FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

                if (!(ignoreSubexpressions && pStatementMap->isSubexpression) &&  pStatementMap->byteCodeSpan.Includes(byteCodeOffset))
                {
                    return pStatementMap;
                }
            }
        }
        return nullptr;
    }